

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O0

void ImGuizmo::DecomposeMatrixToComponents
               (float *matrix,float *translation,float *rotation,float *scale)

{
  float fVar1;
  undefined1 local_68 [8];
  matrix_t mat;
  float *scale_local;
  float *rotation_local;
  float *translation_local;
  float *matrix_local;
  
  mat.field_0._56_8_ = scale;
  matrix_t::matrix_t((matrix_t *)local_68,(matrix_t *)matrix);
  fVar1 = vec_t::Length((vec_t *)local_68);
  *(float *)mat.field_0._56_8_ = fVar1;
  fVar1 = vec_t::Length((vec_t *)&mat.field_0.v.right.z);
  *(float *)(mat.field_0._56_8_ + 4) = fVar1;
  fVar1 = vec_t::Length((vec_t *)&mat.field_0.v.up.z);
  *(float *)(mat.field_0._56_8_ + 8) = fVar1;
  matrix_t::OrthoNormalize((matrix_t *)local_68);
  fVar1 = atan2f(mat.field_0.m[1][0],mat.field_0.m[2][0]);
  *rotation = fVar1 * 57.295776;
  fVar1 = sqrtf(mat.field_0.m[1][0] * mat.field_0.m[1][0] +
                mat.field_0.m[2][0] * mat.field_0.m[2][0]);
  fVar1 = atan2f(-mat.field_0.m[0][0],fVar1);
  rotation[1] = fVar1 * 57.295776;
  fVar1 = atan2f((float)local_68._4_4_,(float)local_68._0_4_);
  rotation[2] = fVar1 * 57.295776;
  *translation = mat.field_0.m[2][2];
  translation[1] = mat.field_0.m[2][3];
  translation[2] = mat.field_0.m[3][0];
  return;
}

Assistant:

void DecomposeMatrixToComponents(const float *matrix, float *translation, float *rotation, float *scale)
   {
      matrix_t mat = *(matrix_t*)matrix;

      scale[0] = mat.v.right.Length();
      scale[1] = mat.v.up.Length();
      scale[2] = mat.v.dir.Length(); 

      mat.OrthoNormalize();

      rotation[0] = RAD2DEG * atan2f(mat.m[1][2], mat.m[2][2]);
      rotation[1] = RAD2DEG * atan2f(-mat.m[0][2], sqrtf(mat.m[1][2] * mat.m[1][2] + mat.m[2][2]* mat.m[2][2]));
      rotation[2] = RAD2DEG * atan2f(mat.m[0][1], mat.m[0][0]);

      translation[0] = mat.v.position.x;
      translation[1] = mat.v.position.y;
      translation[2] = mat.v.position.z;
   }